

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::GetTargetSets
          (cmGlobalGenerator *this,TargetDependSet *projectTargets,TargetDependSet *originalTargets,
          cmLocalGenerator *root,GeneratorVector *generators)

{
  cmGeneratorTarget *target;
  bool bVar1;
  cmLocalGenerator *pcVar2;
  pointer ppcVar3;
  cmGlobalGenerator *pcVar4;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> tgts;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_60;
  GeneratorVector *local_48;
  cmTargetDepend local_40;
  
  ppcVar3 = (generators->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar4 = this;
  local_48 = generators;
  if (ppcVar3 !=
      (generators->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      bVar1 = IsExcluded(pcVar4,root,*ppcVar3);
      if (!bVar1) {
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                  (&local_60,&(*ppcVar3)->GeneratorTargets);
        for (pcVar4 = (cmGlobalGenerator *)
                      local_60.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pcVar4 != (cmGlobalGenerator *)
                      local_60.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pcVar4 = (cmGlobalGenerator *)&pcVar4->TryCompileTimeout) {
          target = (cmGeneratorTarget *)pcVar4->_vptr_cmGlobalGenerator;
          bVar1 = IsRootOnlyTarget(this,target);
          if ((!bVar1) || (pcVar2 = cmGeneratorTarget::GetLocalGenerator(target), pcVar2 == root)) {
            local_40.Link = false;
            local_40.Util = false;
            local_40.Target = target;
            std::
            _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
            ::_M_insert_unique<cmTargetDepend>
                      ((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                        *)originalTargets,&local_40);
            AddTargetDepends(this,target,projectTargets);
          }
        }
        generators = local_48;
        pcVar4 = (cmGlobalGenerator *)
                 local_60.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((cmGlobalGenerator *)
            local_60.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (cmGlobalGenerator *)0x0) {
          operator_delete(local_60.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          generators = local_48;
        }
      }
      ppcVar3 = ppcVar3 + 1;
    } while (ppcVar3 !=
             (generators->
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmGlobalGenerator::GetTargetSets(TargetDependSet& projectTargets,
                                      TargetDependSet& originalTargets,
                                      cmLocalGenerator* root,
                                      GeneratorVector const& generators)
{
  // loop over all local generators
  for (std::vector<cmLocalGenerator*>::const_iterator i = generators.begin();
       i != generators.end(); ++i) {
    // check to make sure generator is not excluded
    if (this->IsExcluded(root, *i)) {
      continue;
    }
    // Get the targets in the makefile
    std::vector<cmGeneratorTarget*> tgts = (*i)->GetGeneratorTargets();
    // loop over all the targets
    for (std::vector<cmGeneratorTarget*>::iterator l = tgts.begin();
         l != tgts.end(); ++l) {
      cmGeneratorTarget* target = *l;
      if (this->IsRootOnlyTarget(target) &&
          target->GetLocalGenerator() != root) {
        continue;
      }
      // put the target in the set of original targets
      originalTargets.insert(target);
      // Get the set of targets that depend on target
      this->AddTargetDepends(target, projectTargets);
    }
  }
}